

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts5ParseNearsetFree(Fts5ExprNearset *pNear)

{
  long lVar1;
  
  if (pNear != (Fts5ExprNearset *)0x0) {
    for (lVar1 = 0; lVar1 < pNear->nPhrase; lVar1 = lVar1 + 1) {
      fts5ExprPhraseFree(pNear->apPhrase[lVar1]);
    }
    sqlite3_free(pNear->pColset);
    sqlite3_free(pNear);
    return;
  }
  return;
}

Assistant:

static void sqlite3Fts5ParseNearsetFree(Fts5ExprNearset *pNear){
  if( pNear ){
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      fts5ExprPhraseFree(pNear->apPhrase[i]);
    }
    sqlite3_free(pNear->pColset);
    sqlite3_free(pNear);
  }
}